

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,Repeat<char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_14UL> *params_3,ArrayPtr<const_char> *params_4,StringPtr *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          FixedArray<char,_1UL> *params_8)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_78;
  size_t local_70;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  long local_50;
  size_t local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_78 = *(undefined8 *)(this + 8);
  local_70 = params->count;
  local_68 = params_1->size_;
  local_60 = params_2->ptr;
  local_58 = *(undefined8 *)params_3->content;
  local_50 = params_4->size_ - 1;
  local_48 = (params_5->content).size_;
  local_40 = params_6->size_;
  local_38 = 1;
  nums._M_len = (size_type)params_5;
  nums._M_array = (iterator)0x9;
  size = sum((_ *)&local_78,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (target,(Repeat<char> *)this,(ArrayPtr<const_char> *)params,params_1,
             (CappedArray<char,_14UL> *)params_2,(ArrayPtr<const_char> *)params_3,
             (StringPtr *)params_4,&params_5->content,params_6,(FixedArray<char,_1UL> *)params_7);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}